

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

exr_result_t validate_tile_data(exr_context_t f,exr_priv_part_t curpart)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  exr_attribute_t *peVar6;
  exr_attr_tiledesc_t *peVar7;
  exr_attr_chlist_t *peVar8;
  exr_attr_chlist_entry_t *peVar9;
  bool bVar10;
  exr_result_t eVar11;
  long lVar12;
  ulong uVar13;
  undefined8 uVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  
  if ((curpart->storage_mode | EXR_STORAGE_DEEP_SCANLINE) != EXR_STORAGE_DEEP_TILED) {
    return 0;
  }
  peVar6 = curpart->tiles;
  if (peVar6 == (exr_attribute_t *)0x0) {
    pcVar15 = "\'tiles\' attribute for tiled file not found";
    eVar11 = 0xd;
  }
  else {
    if (peVar6->type == EXR_ATTR_TILEDESC) {
      peVar7 = (peVar6->field_6).tiledesc;
      uVar2 = peVar7->x_size;
      uVar13 = (ulong)uVar2;
      if ((uVar2 == 0) ||
         (uVar3 = peVar7->y_size, 0x1fffffff < uVar2 || uVar3 + 0xe0000000 < 0xe0000001)) {
        uVar17 = (ulong)peVar7->y_size;
        pcVar15 = "Invalid tile description size (%u x %u)";
      }
      else {
        uVar4 = f->max_tile_w;
        uVar5 = f->max_tile_h;
        uVar17 = (ulong)uVar5;
        peVar8 = (curpart->channels->field_6).chlist;
        bVar1 = peVar7->level_and_round;
        if (((int)uVar4 < 1) || ((int)uVar2 <= (int)uVar4)) {
          if (((int)uVar5 < 1) || ((int)uVar3 <= (int)uVar5)) {
            uVar13 = (ulong)(bVar1 & 0xf);
            if ((bVar1 & 0xf) < 3) {
              if (bVar1 < 0x20) {
                lVar12 = (long)peVar8->num_channels;
                bVar10 = true;
                if (0 < lVar12) {
                  peVar9 = peVar8->entries;
                  lVar12 = lVar12 * 0x20;
                  lVar16 = 0;
                  do {
                    if (*(int *)(peVar9->reserved + lVar16 + 3) != 1) {
                      uVar14 = *(undefined8 *)(peVar9->reserved + lVar16 + -0xd);
                      pcVar15 = 
                      "channel \'%s\': x subsampling factor is not 1 (%d) for a tiled image";
LAB_00134e60:
                      bVar10 = false;
                      eVar11 = (*f->print_error)(f,0xe,pcVar15,uVar14);
                      goto LAB_00134d78;
                    }
                    if (*(int *)(peVar9->reserved + lVar16 + 7) != 1) {
                      uVar14 = *(undefined8 *)(peVar9->reserved + lVar16 + -0xd);
                      pcVar15 = 
                      "channel \'%s\': y subsampling factor is not 1 (%d) for a tiled image";
                      goto LAB_00134e60;
                    }
                    lVar16 = lVar16 + 0x20;
                  } while (lVar12 != lVar16);
                }
                eVar11 = (exr_result_t)lVar12;
                goto LAB_00134d78;
              }
              uVar13 = (ulong)(bVar1 >> 4);
              pcVar15 = "Invalid rounding mode (%d) in tile description header";
            }
            else {
              pcVar15 = "Invalid level mode (%d) in tile description header";
            }
            bVar10 = false;
            eVar11 = (*f->print_error)(f,0xe,pcVar15,uVar13);
            goto LAB_00134d78;
          }
          pcVar15 = "Width of tile exceeds max size (%d vs max %d)";
          uVar13 = (ulong)uVar3;
        }
        else {
          pcVar15 = "Width of tile exceeds max size (%d vs max %d)";
          uVar17 = (ulong)uVar4;
        }
      }
      bVar10 = false;
      eVar11 = (*f->print_error)(f,0xe,pcVar15,uVar13,uVar17);
      goto LAB_00134d78;
    }
    pcVar15 = "\'tiles\' attribute has wrong data type, expect tile description";
    eVar11 = 0x10;
  }
  bVar10 = false;
  eVar11 = (*f->print_error)(f,eVar11,pcVar15);
LAB_00134d78:
  if (bVar10) {
    return 0;
  }
  return eVar11;
}

Assistant:

static exr_result_t
validate_tile_data (exr_context_t f, exr_priv_part_t curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_TILED ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_tiledesc_t* desc;
        const int                  maxtilew = f->max_tile_w;
        const int                  maxtileh = f->max_tile_h;
        const exr_attr_chlist_t*   channels = curpart->channels->chlist;
        exr_tile_level_mode_t      levmode;
        exr_tile_round_mode_t      rndmode;

        if (!curpart->tiles)
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'tiles' attribute for tiled file not found");
        else if (curpart->tiles->type != EXR_ATTR_TILEDESC)
            return f->print_error (
                f,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'tiles' attribute has wrong data type, expect tile description");

        desc    = curpart->tiles->tiledesc;
        levmode = EXR_GET_TILE_LEVEL_MODE (*desc);
        rndmode = EXR_GET_TILE_ROUND_MODE (*desc);

        if (desc->x_size == 0 || desc->y_size == 0 ||
            desc->x_size > (uint32_t) (INT_MAX / 4) ||
            desc->y_size > (uint32_t) (INT_MAX / 4))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid tile description size (%u x %u)",
                desc->x_size,
                desc->y_size);
        if (maxtilew > 0 && maxtilew < (int) (desc->x_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->x_size,
                maxtilew);
        if (maxtileh > 0 && maxtileh < (int) (desc->y_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->y_size,
                maxtileh);

        if ((int) levmode < EXR_TILE_ONE_LEVEL ||
            (int) levmode >= EXR_TILE_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid level mode (%d) in tile description header",
                (int) levmode);

        if ((int) rndmode < EXR_TILE_ROUND_DOWN ||
            (int) rndmode >= EXR_TILE_ROUND_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid rounding mode (%d) in tile description header",
                (int) rndmode);

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}